

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::elemsStr<float_const*>
          (string *__return_storage_ptr__,Functional *this,float **begin,float **end,
          int wrapLengthParam,int numIndentationSpaces)

{
  bool bVar1;
  difference_type dVar2;
  int local_29c;
  allocator<char> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  byte local_222;
  allocator<char> local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  float *local_1a0;
  float *it;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_ad;
  int local_ac;
  int local_a8;
  int length;
  int wrapLength;
  undefined1 local_80 [8];
  string deepIndentation;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string baseIndentation;
  int numIndentationSpaces_local;
  int wrapLengthParam_local;
  float **end_local;
  float **begin_local;
  string *result;
  
  baseIndentation.field_2._12_4_ = SUB84(end,0);
  baseIndentation.field_2._8_4_ = wrapLengthParam;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,(long)wrapLengthParam,' ',&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&wrapLength,4,' ',(allocator<char> *)((long)&length + 3));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wrapLength);
  std::__cxx11::string::~string((string *)&wrapLength);
  std::allocator<char>::~allocator((allocator<char> *)((long)&length + 3));
  if ((int)baseIndentation.field_2._12_4_ < 1) {
    local_29c = std::numeric_limits<int>::max();
  }
  else {
    local_29c = baseIndentation.field_2._12_4_;
  }
  local_a8 = local_29c;
  dVar2 = std::distance<float_const*>(*(float **)this,*begin);
  local_ac = (int)dVar2;
  local_ad = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_a8 < local_ac) {
    de::toString<int>(&local_110,&local_ac);
    std::operator+(&local_f0,"(amount: ",&local_110);
    std::operator+(&local_d0,&local_f0,") ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::__cxx11::string::string((string *)&local_170);
  std::operator+(&local_150,&local_170,"{");
  it._6_1_ = 0;
  if (local_a8 < local_ac) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,"\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  }
  else {
    std::allocator<char>::allocator();
    it._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&index," ",(allocator<char> *)((long)&it + 7));
  }
  std::operator+(&local_130,&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&index);
  if ((it._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&it + 7));
  }
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  it._0_4_ = 0;
  for (local_1a0 = *(float **)this; local_1a0 != *begin; local_1a0 = local_1a0 + 1) {
    if (local_1a0 != *(float **)this) {
      std::__cxx11::string::string((string *)&local_200);
      std::operator+(&local_1e0,&local_200,", ");
      local_222 = 0;
      if ((int)it % local_a8 == 0) {
        std::operator+(&local_220,"\n",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
      }
      else {
        std::allocator<char>::allocator();
        local_222 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_221);
      }
      std::operator+(&local_1c0,&local_1e0,&local_220);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_220);
      if ((local_222 & 1) != 0) {
        std::allocator<char>::~allocator(&local_221);
      }
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
    }
    de::toString<float>(&local_248,local_1a0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    it._0_4_ = (int)it + 1;
  }
  bVar1 = local_ac <= local_a8;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268," ",&local_269);
  }
  else {
    std::operator+(&local_268,"\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  if (bVar1) {
    std::allocator<char>::~allocator(&local_269);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
  local_ad = 1;
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static string elemsStr (const IterT& begin, const IterT& end, int wrapLengthParam = 0, int numIndentationSpaces = 0)
{
	const string	baseIndentation	= string(numIndentationSpaces, ' ');
	const string	deepIndentation	= baseIndentation + string(4, ' ');
	const int		wrapLength		= wrapLengthParam > 0 ? wrapLengthParam : std::numeric_limits<int>::max();
	const int		length			= (int)std::distance(begin, end);
	string			result;

	if (length > wrapLength)
		result += "(amount: " + de::toString(length) + ") ";
	result += string() + "{" + (length > wrapLength ? "\n"+deepIndentation : " ");

	{
		int index = 0;
		for (IterT it = begin; it != end; ++it)
		{
			if (it != begin)
				result += string() + ", " + (index % wrapLength == 0 ? "\n"+deepIndentation : "");
			result += de::toString(*it);
			index++;
		}

		result += length > wrapLength ? "\n"+baseIndentation : " ";
	}

	result += "}";
	return result;
}